

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O1

void __thiscall
FunctionCallExpression::GenerateCode(FunctionCallExpression *this,ostream *out,int n)

{
  long *plVar1;
  undefined8 in_RAX;
  long lVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  (*((this->m_function).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Expression[1])();
  uStack_38._0_7_ = CONCAT16(0x28,(undefined6)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 6),1);
  if ((this->m_arguments).
      super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_arguments).
      super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      }
      plVar1 = *(long **)((long)&(((this->m_arguments).
                                   super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         + lVar2);
      (**(code **)(*plVar1 + 8))(plVar1,out,n);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->m_arguments).
                                   super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_arguments).
                                   super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  uStack_38 = CONCAT17(0x29,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		m_function->GenerateCode(out, n);
		out << '(';
		
		for( size_t i = 0; i < m_arguments.size(); ++i)
		{
			if (i > 0)
				out << ", ";

			m_arguments[i]->GenerateCode(out, n);
		}

		out << ')';
	}